

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O0

bool __thiscall sznet::net::Poller::hasChannel(Poller *this,Channel *channel)

{
  bool bVar1;
  pointer ppVar2;
  bool local_31;
  _Self local_30;
  sz_fd local_24;
  _Self local_20;
  const_iterator it;
  Channel *channel_local;
  Poller *this_local;
  
  it._M_node = (_Base_ptr)channel;
  assertInLoopThread(this);
  local_24 = Channel::fd((Channel *)it._M_node);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
       ::find(&this->m_channels,&local_24);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
       ::end(&this->m_channels);
  bVar1 = std::operator!=(&local_20,&local_30);
  local_31 = false;
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_sznet::net::Channel_*>_>::operator->
                       (&local_20);
    local_31 = ppVar2->second == (Channel *)it._M_node;
  }
  return local_31;
}

Assistant:

bool Poller::hasChannel(Channel* channel) const
{
	assertInLoopThread();
	ChannelMap::const_iterator it = m_channels.find(channel->fd());
	return it != m_channels.end() && it->second == channel;
}